

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

void __thiscall OpenMD::SimInfo::update(SimInfo *this)

{
  setupSimVariables(this);
  this->nGlobalConstraints_ = this->nConstraints_;
  calcNdf(this);
  calcNdfRaw(this);
  this->ndfTrans_ =
       ((this->nIntegrableObjects_ * 3 - this->nConstraints_) - this->nZconstraint_) + -3;
  return;
}

Assistant:

void SimInfo::update() {
    setupSimVariables();
    calcNConstraints();
    calcNdf();
    calcNdfRaw();
    calcNdfTrans();
  }